

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O2

Path * __thiscall Pathie::Path::operator[](Path *__return_storage_ptr__,Path *this,size_t index)

{
  long lVar1;
  out_of_range *this_00;
  bool bVar2;
  allocator local_b1;
  allocator local_b0 [32];
  string local_90;
  string local_70;
  string local_50;
  
  if ((index == 0) && (*(this->m_path)._M_dataplus._M_p == '/')) {
    std::__cxx11::string::string((string *)&local_90,"/",local_b0);
    Path(__return_storage_ptr__,&local_90);
    std::__cxx11::string::_M_dispose();
  }
  else {
    do {
      lVar1 = std::__cxx11::string::find((char *)this,0x10f18c);
      if (lVar1 == -1) {
        if (index != 0) {
          this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
          std::__cxx11::string::string((string *)local_b0,"Index out of path range",&local_b1);
          std::out_of_range::out_of_range(this_00,(string *)local_b0);
          __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
        }
        std::__cxx11::string::substr((ulong)&local_70,(ulong)this);
        Path(__return_storage_ptr__,&local_70);
        goto LAB_0010c21d;
      }
      bVar2 = index != 0;
      index = index - 1;
    } while (bVar2);
    std::__cxx11::string::substr((ulong)&local_50,(ulong)this);
    Path(__return_storage_ptr__,&local_50);
LAB_0010c21d:
    std::__cxx11::string::_M_dispose();
  }
  return __return_storage_ptr__;
}

Assistant:

Path Path::operator[](size_t index) const
{
  // Absolute path index 0 needs special treatment
  if (index == 0 && m_path[0] == '/')
    return Path("/");

  size_t pos     = 0;
  size_t lastpos = 0;
  size_t i       = 0;
  while ((pos = m_path.find("/", pos)) != string::npos) { // Assignment intended
    if (i == index)
      return Path(m_path.substr(lastpos, pos - lastpos));

    lastpos = pos + 1;
    pos++;
    i++;
  }

  // Last element requested
  if (index == i)
    return Path(m_path.substr(lastpos));

  // Out of range
  throw(std::out_of_range("Index out of path range"));
}